

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::insert
          (SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U> *this,
          TypeModulePair *key,TypeBase **value)

{
  Node *pNVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  TypeModulePair local_68;
  Node *local_50;
  Node *item;
  uint i;
  uint local_3c;
  uint bucket;
  uint bucketMask;
  TypeBase **local_20;
  TypeBase **value_local;
  TypeModulePair *key_local;
  SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U> *this_local;
  
  local_20 = value;
  value_local = (TypeBase **)key;
  key_local = (TypeModulePair *)this;
  TypeModulePair::TypeModulePair((TypeModulePair *)&bucket);
  bVar2 = TypeModulePair::operator!=(key,(TypeModulePair *)&bucket);
  if (!bVar2) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<TypeModulePair, TypeBase *, TypeModulePairHasher, 32>::insert(const Key &, const Value &) [Key = TypeModulePair, Value = TypeBase *, Hasher = TypeModulePairHasher, N = 32]"
                 );
  }
  if (this->bucketCount <= this->count + (this->count >> 2)) {
    rehash(this);
  }
  local_3c = this->bucketCount - 1;
  uVar3 = TypeModulePairHasher::operator()
                    ((TypeModulePairHasher *)((long)&item + 7),(TypeModulePair *)value_local);
  i = uVar3 & local_3c;
  item._0_4_ = 0;
  while( true ) {
    if (this->bucketCount <= (uint)item) {
      __assert_fail("!\"couldn\'t insert node\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                    ,0x5b,
                    "void SmallDenseMap<TypeModulePair, TypeBase *, TypeModulePairHasher, 32>::insert(const Key &, const Value &) [Key = TypeModulePair, Value = TypeBase *, Hasher = TypeModulePairHasher, N = 32]"
                   );
    }
    pNVar1 = this->data;
    uVar4 = (ulong)i;
    local_50 = pNVar1 + uVar4;
    TypeModulePair::TypeModulePair(&local_68);
    bVar2 = TypeModulePair::operator==(&pNVar1[uVar4].key,&local_68);
    if (bVar2) break;
    bVar2 = TypeModulePair::operator==(&local_50->key,(TypeModulePair *)value_local);
    if (bVar2) {
      local_50->value = *local_20;
      return;
    }
    i = i + (uint)item + 1 & local_3c;
    item._0_4_ = (uint)item + 1;
  }
  (local_50->key).typeName.begin = (char *)*value_local;
  (local_50->key).typeName.end = (char *)value_local[1];
  (local_50->key).importModule = (ModuleData *)value_local[2];
  local_50->value = *local_20;
  this->count = this->count + 1;
  return;
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}